

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.cpp
# Opt level: O1

void __thiscall
stackjit::CodeGenerator::generateZeroLocals
          (CodeGenerator *this,ManagedFunction *function,Amd64Assembler *assembler)

{
  size_t sVar1;
  FunctionDefinition *this_00;
  ulong uVar2;
  int iVar3;
  IntRegister local_48;
  IntRegister local_44;
  IntRegister local_40;
  IntRegister local_3c;
  MemoryOperand local_38;
  
  sVar1 = ManagedFunction::numLocals(function);
  if (sVar1 != 0) {
    IntRegister::IntRegister(&local_3c,AX);
    IntRegister::IntRegister(&local_40,AX);
    Amd64Assembler::bitwiseXor(assembler,local_3c,local_40,false);
    sVar1 = ManagedFunction::numLocals(function);
    if (sVar1 != 0) {
      iVar3 = -8;
      uVar2 = 0;
      do {
        this_00 = ManagedFunction::def(function);
        sVar1 = FunctionDefinition::numParameters(this_00);
        IntRegister::IntRegister(&local_44,BP);
        MemoryOperand::MemoryOperand(&local_38,local_44,iVar3 + (int)sVar1 * -8);
        IntRegister::IntRegister(&local_48,AX);
        Amd64Assembler::move(assembler,local_38,local_48,Size64);
        uVar2 = uVar2 + 1;
        sVar1 = ManagedFunction::numLocals(function);
        iVar3 = iVar3 + -8;
      } while (uVar2 < sVar1);
    }
  }
  return;
}

Assistant:

void CodeGenerator::generateZeroLocals(ManagedFunction& function, Amd64Assembler& assembler) {
		//Zero the locals
		if (function.numLocals() > 0) {
			assembler.bitwiseXor(Registers::AX, Registers::AX);	//Zero rax

			for (int i = 0; i < function.numLocals(); i++) {
				int localOffset = (int)((i + function.def().numParameters() + 1) * -Amd64Backend::REGISTER_SIZE);
				assembler.move({ Registers::BP, localOffset }, Registers::AX);
			}
		}
	}